

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSetParserErrors
               (xmlSchemaParserCtxtPtr ctxt,xmlSchemaValidityErrorFunc err,
               xmlSchemaValidityWarningFunc warn,void *ctx)

{
  xmlSchemaValidCtxtPtr pxVar1;
  
  while( true ) {
    if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
      return;
    }
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    pxVar1 = ctxt->vctxt;
    if (pxVar1 == (xmlSchemaValidCtxtPtr)0x0) break;
    pxVar1->error = err;
    pxVar1->warning = warn;
    pxVar1->errCtxt = ctx;
    ctxt = pxVar1->pctxt;
    if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
      return;
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetParserErrors(xmlSchemaParserCtxtPtr ctxt,
                         xmlSchemaValidityErrorFunc err,
                         xmlSchemaValidityWarningFunc warn, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    if (ctxt->vctxt != NULL)
	xmlSchemaSetValidErrors(ctxt->vctxt, err, warn, ctx);
}